

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void Js::SCASerializationEngine::Serialize
               (Var root,StreamWriter *writer,Var *transferableVars,size_t cTransferableVars,
               List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sharedContentsList)

{
  ScriptContext *scriptContext_00;
  undefined1 local_60 [8];
  StreamSerializationCloner cloner;
  ScriptContext *scriptContext;
  List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *sharedContentsList_local;
  size_t cTransferableVars_local;
  Var *transferableVars_local;
  StreamWriter *writer_local;
  Var root_local;
  
  scriptContext_00 = ScriptContextHolder::GetScriptContext(&writer->super_ScriptContextHolder);
  cloner.m_sharedContentsrList._4_4_ = 0x1000000;
  StreamWriter::Write<unsigned_int>(writer,(uint *)((long)&cloner.m_sharedContentsrList + 4));
  SerializationCloner<Js::StreamWriter>::SerializationCloner
            ((SerializationCloner<Js::StreamWriter> *)local_60,scriptContext_00,writer,
             sharedContentsList);
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
            (root,(SerializationCloner<Js::StreamWriter> *)local_60,transferableVars,
             cTransferableVars);
  return;
}

Assistant:

void SCASerializationEngine::Serialize(Var root, StreamWriter* writer, Var* transferableVars, size_t cTransferableVars,
        JsUtil::List<Js::SharedContents*, HeapAllocator>* sharedContentsList)
    {
        ScriptContext* scriptContext = writer->GetScriptContext();

        // Write version
        writer->Write(static_cast<uint32>(SCA_FORMAT_VERSION));

        StreamSerializationCloner cloner(scriptContext, writer, sharedContentsList);
        SCAEngine<Var, scaposition_t, StreamSerializationCloner>::Clone(root, &cloner, transferableVars, cTransferableVars);
    }